

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BalanceFunction.cpp
# Opt level: O1

bool __thiscall
BalanceFunction::check_same_particle(BalanceFunction *this,particle_info *lhs,particle_info *rhs)

{
  if ((((lhs->monval == rhs->monval) && (ABS(lhs->E - rhs->E) < 1e-15)) &&
      (ABS(lhs->px - rhs->px) < 1e-15)) &&
     (((ABS(lhs->py - rhs->py) < 1e-15 && (ABS(lhs->t - rhs->t) < 1e-15)) &&
      ((ABS(lhs->x - rhs->x) < 1e-15 && (ABS(lhs->y - rhs->y) < 1e-15)))))) {
    return true;
  }
  return false;
}

Assistant:

bool BalanceFunction::check_same_particle(
    const particle_info& lhs, const particle_info& rhs) {
    bool flag = false;
    const double tol = 1e-15;
    if (lhs.monval == rhs.monval) {
        if (std::abs(lhs.E - rhs.E) < tol) {
            if (std::abs(lhs.px - rhs.px) < tol) {
                if (std::abs(lhs.py - rhs.py) < tol) {
                    if (std::abs(lhs.t - rhs.t) < tol) {
                        if (std::abs(lhs.x - rhs.x) < tol) {
                            if (std::abs(lhs.y - rhs.y) < tol) {
                                flag = true;
                            }
                        }
                    }
                }
            }
        }
    }
    return (flag);
}